

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall icu_63::double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int local_24;
  int local_20;
  int i_1;
  int i;
  int zero_digits;
  Bignum *other_local;
  Bignum *this_local;
  
  if (other->exponent_ < this->exponent_) {
    iVar2 = this->exponent_ - other->exponent_;
    EnsureCapacity(this,this->used_digits_ + iVar2);
    local_20 = this->used_digits_;
    while (local_20 = local_20 + -1, -1 < local_20) {
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,local_20);
      uVar1 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,local_20 + iVar2);
      *puVar3 = uVar1;
    }
    for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,local_24);
      *puVar3 = 0;
    }
    this->used_digits_ = iVar2 + this->used_digits_;
    this->exponent_ = this->exponent_ - iVar2;
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" digit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    int zero_digits = exponent_ - other.exponent_;
    EnsureCapacity(used_digits_ + zero_digits);
    for (int i = used_digits_ - 1; i >= 0; --i) {
      bigits_[i + zero_digits] = bigits_[i];
    }
    for (int i = 0; i < zero_digits; ++i) {
      bigits_[i] = 0;
    }
    used_digits_ += zero_digits;
    exponent_ -= zero_digits;
    ASSERT(used_digits_ >= 0);
    ASSERT(exponent_ >= 0);
  }
}